

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FException.cpp
# Opt level: O0

void __thiscall MeshLib::FException::what(FException *this)

{
  ostream *this_00;
  FException *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,this->msg);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
FException::what()
{
	std::cout << msg << std::endl;
}